

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhMapWriteRecord(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)

{
  int iVar1;
  unqlite_page *local_48;
  unqlite_page *pOld;
  unqlite_page *puStack_38;
  int rc;
  unqlite_page *pPage;
  lhash_bmap_page *pMap;
  pgno iReal_local;
  pgno iLogic_local;
  lhash_kv_engine *pEngine_local;
  
  pPage = (unqlite_page *)&pEngine->sPageMap;
  puStack_38 = (unqlite_page *)0x0;
  pMap = (lhash_bmap_page *)iReal;
  iReal_local = iLogic;
  iLogic_local = (pgno)pEngine;
  if (pEngine->iPageSize + -0x10 < (int)(uint)(pEngine->sPageMap).iPtr) {
    pOld._4_4_ = (*pEngine->pIo->xGet)
                           (pEngine->pIo->pHandle,((lhash_bmap_page *)pPage)->iNum,&local_48);
    if (pOld._4_4_ != 0) {
      return pOld._4_4_;
    }
    pOld._4_4_ = lhAcquirePage((lhash_kv_engine *)iLogic_local,&stack0xffffffffffffffc8);
    if (pOld._4_4_ != 0) {
      return pOld._4_4_;
    }
    pPage->iPage = 0;
    pPage->zData = (uchar *)puStack_38->iPage;
    *(undefined4 *)((long)&pPage->pUserData + 4) = 0;
    *(undefined2 *)&pPage->pUserData = 0xc;
    pOld._4_4_ = (**(code **)(*(long *)iLogic_local + 0x28))(local_48);
    if (pOld._4_4_ != 0) {
      return pOld._4_4_;
    }
    if (local_48->iPage == *(pgno *)(*(long *)(iLogic_local + 0xd0) + 0x10)) {
      SyBigEndianPack64(local_48->zData + 0x20,puStack_38->iPage);
    }
    else {
      SyBigEndianPack64(local_48->zData,puStack_38->iPage);
      (**(code **)(*(long *)iLogic_local + 0x50))(local_48);
    }
    pOld._4_4_ = (**(code **)(*(long *)iLogic_local + 0x28))(puStack_38);
    if (pOld._4_4_ != 0) {
      return pOld._4_4_;
    }
    SyBigEndianPack64(puStack_38->zData,0);
  }
  if (puStack_38 == (unqlite_page *)0x0) {
    iVar1 = (**(code **)(*(long *)iLogic_local + 0x10))
                      (**(undefined8 **)iLogic_local,pPage->zData,&stack0xffffffffffffffc8);
    if (iVar1 != 0) {
      return iVar1;
    }
    pOld._4_4_ = 0;
  }
  pOld._4_4_ = (**(code **)(*(long *)iLogic_local + 0x28))(puStack_38);
  pEngine_local._4_4_ = pOld._4_4_;
  if (pOld._4_4_ == 0) {
    SyBigEndianPack64(puStack_38->zData + *(ushort *)&pPage->pUserData,iReal_local);
    *(short *)&pPage->pUserData = *(short *)&pPage->pUserData + 8;
    SyBigEndianPack64(puStack_38->zData + *(ushort *)&pPage->pUserData,(sxu64)pMap);
    *(short *)&pPage->pUserData = *(short *)&pPage->pUserData + 8;
    pOld._4_4_ = lhMapInstallBucket((lhash_kv_engine *)iLogic_local,iReal_local,(pgno)pMap);
    if (pOld._4_4_ == 0) {
      *(int *)((long)&pPage->pUserData + 4) = *(int *)((long)&pPage->pUserData + 4) + 1;
      if (puStack_38->iPage == *(pgno *)(*(long *)(iLogic_local + 0xd0) + 0x10)) {
        SyBigEndianPack32(puStack_38->zData + 0x28,*(sxu32 *)((long)&pPage->pUserData + 4));
      }
      else {
        pOld._4_4_ = (**(code **)(*(long *)iLogic_local + 0x28))(puStack_38);
        if (pOld._4_4_ != 0) {
          return pOld._4_4_;
        }
        SyBigEndianPack32(puStack_38->zData + 8,*(sxu32 *)((long)&pPage->pUserData + 4));
      }
    }
    pEngine_local._4_4_ = pOld._4_4_;
  }
  return pEngine_local._4_4_;
}

Assistant:

static int lhMapWriteRecord(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)
{
	lhash_bmap_page *pMap = &pEngine->sPageMap;
	unqlite_page *pPage = 0;
	int rc;
	if( pMap->iPtr > (pEngine->iPageSize - 16) /* 8 byte logical bucket number + 8 byte real bucket number */ ){
		unqlite_page *pOld;
		/* Point to the old page */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pMap->iNum,&pOld);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Acquire a new page */
		rc = lhAcquirePage(pEngine,&pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Reflect the change  */
		pMap->iNext = 0;
		pMap->iNum = pPage->iPage;
		pMap->nRec = 0;
		pMap->iPtr = 8/* Next page number */+4/* Total records in the map*/;
		/* Link this page */
		rc = pEngine->pIo->xWrite(pOld);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		if( pOld->iPage == pEngine->pHeader->iPage ){
			/* First page (Hash header) */
			SyBigEndianPack64(&pOld->zData[4/*magic*/+4/*hash*/+8/* Free page */+8/*current split bucket*/+8/*Maximum split bucket*/],pPage->iPage);
		}else{
			/* Link the new page */
			SyBigEndianPack64(pOld->zData,pPage->iPage);
			/* Unref */
			pEngine->pIo->xPageUnref(pOld);
		}
		/* Assume the last bucket map page */
		rc = pEngine->pIo->xWrite(pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		SyBigEndianPack64(pPage->zData,0); /* Next bucket map page on the list */
	}
	if( pPage == 0){
		/* Point to the current map page */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pMap->iNum,&pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	/* Make page writable */
	rc = pEngine->pIo->xWrite(pPage);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Write the data */
	SyBigEndianPack64(&pPage->zData[pMap->iPtr],iLogic);
	pMap->iPtr += 8;
	SyBigEndianPack64(&pPage->zData[pMap->iPtr],iReal);
	pMap->iPtr += 8;
	/* Install the bucket map */
	rc = lhMapInstallBucket(pEngine,iLogic,iReal);
	if( rc == UNQLITE_OK ){
		/* Total number of records */
		pMap->nRec++;
		if( pPage->iPage == pEngine->pHeader->iPage ){
			/* Page one: Always writable */
			SyBigEndianPack32(
				&pPage->zData[4/*magic*/+4/*hash*/+8/* Free page */+8/*current split bucket*/+8/*Maximum split bucket*/+8/*Next map page*/],
				pMap->nRec);
		}else{
			/* Make page writable */
			rc = pEngine->pIo->xWrite(pPage);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			SyBigEndianPack32(&pPage->zData[8],pMap->nRec);
		}
	}
	return rc;
}